

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.h
# Opt level: O3

Availability __thiscall
miniscript::Node<CPubKey>::Satisfy<(anonymous_namespace)::Satisfier>
          (Node<CPubKey> *this,Satisfier *ctx,
          vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          *stack,bool nonmalleable)

{
  uint uVar1;
  ulong uVar2;
  pointer __args_2;
  byte bVar3;
  void *pvVar4;
  vector<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
  *this_00;
  byte bVar5;
  _Optional_payload_base<miniscript::internal::InputResult> *this_01;
  Node<CPubKey> *node;
  Availability AVar6;
  void *pvVar7;
  _Optional_payload_base<miniscript::internal::InputResult> *this_02;
  long in_FS_OFFSET;
  Span<miniscript::internal::InputResult> subres;
  vector<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
  results;
  vector<StackElem,_std::allocator<StackElem>_> stack_1;
  InputResult ret;
  pointer local_158;
  pointer local_150;
  anon_class_8_1_ba1d3d87 local_140;
  vector<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
  local_138;
  void *local_118;
  void *pvStack_110;
  long local_108;
  undefined1 local_f8 [16];
  undefined1 local_e8 [80];
  undefined1 local_98 [56];
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_60;
  bool local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_108 = 0;
  local_118 = (void *)0x0;
  pvStack_110 = (void *)0x0;
  local_138.
  super__Vector_base<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_138.
  super__Vector_base<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.
  super__Vector_base<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
  ._M_impl.super__Vector_impl_data._M_finish = (InputResult *)0x0;
  local_98._0_8_ = local_98._0_8_ & 0xffffffff00000000;
  local_140.ctx = ctx;
  std::
  vector<miniscript::Node<CPubKey>::TreeEvalMaybe<miniscript::internal::InputResult,miniscript::Node<CPubKey>::TreeEval<miniscript::internal::InputResult,miniscript::Node<CPubKey>::ProduceInput<(anonymous_namespace)::Satisfier>((anonymous_namespace)::Satisfier_const&)const::{lambda(miniscript::Node<CPubKey>const&,Span<miniscript::internal::InputResult>)#2}>(miniscript::Node<CPubKey>::ProduceInput<(anonymous_namespace)::Satisfier>((anonymous_namespace)::Satisfier_const&)const::{lambda(miniscript::Node<CPubKey>const&,Span<miniscript::internal::InputResult>)#2})const::DummyState,miniscript::Node<CPubKey>::TreeEval<miniscript::internal::InputResult,miniscript::Node<CPubKey>::ProduceInput<(anonymous_namespace)::Satisfier>((anonymous_namespace)::Satisfier_const&)const::{lambda(miniscript::Node<CPubKey>const&,Span<miniscript::internal::InputResult>)#2}>(miniscript::Node<CPubKey>::ProduceInput<(anonymous_namespace)::Satisfier>((anonymous_namespace)::Satisfier_const&)const::{lambda(miniscript::No...State,miniscript::Node<CPubKey>const&,Span<miniscript::internal::InputResult>)#1})const::StackElem>>
  ::
  emplace_back<miniscript::Node<CPubKey>const&,int,miniscript::Node<CPubKey>::TreeEval<miniscript::internal::InputResult,miniscript::Node<CPubKey>::ProduceInput<(anonymous_namespace)::Satisfier>((anonymous_namespace)::Satisfier_const&)const::_lambda(miniscript::Node<CPubKey>const&,Span<miniscript::internal::InputResult>)_2_>(miniscript::Node<CPubKey>::ProduceInput<(anonymous_namespace)::Satisfier>((anonymous_namespace)::Satisfier_const&)const::_lambda(miniscript::Node<CPubKey>const&,Span<miniscript::internal::InputResult>)_2_)const::DummyState>
            ((vector<miniscript::Node<CPubKey>::TreeEvalMaybe<miniscript::internal::InputResult,miniscript::Node<CPubKey>::TreeEval<miniscript::internal::InputResult,miniscript::Node<CPubKey>::ProduceInput<(anonymous_namespace)::Satisfier>((anonymous_namespace)::Satisfier_const&)const::_lambda(miniscript::Node<CPubKey>const&,Span<miniscript::internal::InputResult>)_2_>(miniscript::Node<CPubKey>::ProduceInput<(anonymous_namespace)::Satisfier>((anonymous_namespace)::Satisfier_const&)const::_lambda(miniscript::Node<CPubKey>const&,Span<miniscript::internal::InputResult>)_2_)const::DummyState,miniscript::Node<CPubKey>::TreeEval<miniscript::internal::InputResult,miniscript::Node<CPubKey>::ProduceInput<(anonymous_namespace)::Satisfier>((anonymous_namespace)::Satisfier_const&)const::_lambda(miniscript::Node<CPubKey>const&,Span<miniscript::internal::InputResult>)_2_>(miniscript::Node<CPubKey>::ProduceInput<(anonymous_namespace)::Satisfier>((anonymous_namespace)::Satisfier_const&)const::_lambda(miniscript::No___State,miniscript::Node<CPubKey>const&,Span<miniscript::internal::InputResult>)_1_)const::StackElem>>
              *)&local_118,this,(int *)local_98,(bool *)0x0);
  pvVar7 = local_118;
  if (pvStack_110 != local_118) {
    this_02 = (_Optional_payload_base<miniscript::internal::InputResult> *)local_e8;
    this_01 = (_Optional_payload_base<miniscript::internal::InputResult> *)local_98;
    this_00 = &local_138;
    pvVar4 = pvStack_110;
    do {
      node = *(Node<CPubKey> **)((long)pvVar4 + -0x18);
      uVar2 = *(ulong *)((long)pvVar4 + -0x10);
      __args_2 = (node->subs).
                 super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      subres.m_size =
           (long)(node->subs).
                 super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)__args_2 >> 4;
      if (uVar2 < subres.m_size) {
        *(ulong *)((long)pvVar4 + -0x10) = uVar2 + 1;
        local_98._0_8_ = local_98._0_8_ & 0xffffffff00000000;
        std::
        vector<miniscript::Node<CPubKey>::TreeEvalMaybe<miniscript::internal::InputResult,miniscript::Node<CPubKey>::TreeEval<miniscript::internal::InputResult,miniscript::Node<CPubKey>::ProduceInput<(anonymous_namespace)::Satisfier>((anonymous_namespace)::Satisfier_const&)const::{lambda(miniscript::Node<CPubKey>const&,Span<miniscript::internal::InputResult>)#2}>(miniscript::Node<CPubKey>::ProduceInput<(anonymous_namespace)::Satisfier>((anonymous_namespace)::Satisfier_const&)const::{lambda(miniscript::Node<CPubKey>const&,Span<miniscript::internal::InputResult>)#2})const::DummyState,miniscript::Node<CPubKey>::TreeEval<miniscript::internal::InputResult,miniscript::Node<CPubKey>::ProduceInput<(anonymous_namespace)::Satisfier>((anonymous_namespace)::Satisfier_const&)const::{lambda(miniscript::Node<CPubKey>const&,Span<miniscript::internal::InputResult>)#2}>(miniscript::Node<CPubKey>::ProduceInput<(anonymous_namespace)::Satisfier>((anonymous_namespace)::Satisfier_const&)const::{lambda(miniscript::No...State,miniscript::Node<CPubKey>const&,Span<miniscript::internal::InputResult>)#1})const::StackElem>>
        ::
        emplace_back<miniscript::Node<CPubKey>const&,int,miniscript::Node<CPubKey>::TreeEval<miniscript::internal::InputResult,miniscript::Node<CPubKey>::ProduceInput<(anonymous_namespace)::Satisfier>((anonymous_namespace)::Satisfier_const&)const::_lambda(miniscript::Node<CPubKey>const&,Span<miniscript::internal::InputResult>)_2_>(miniscript::Node<CPubKey>::ProduceInput<(anonymous_namespace)::Satisfier>((anonymous_namespace)::Satisfier_const&)const::_lambda(miniscript::Node<CPubKey>const&,Span<miniscript::internal::InputResult>)_2_)const::DummyState>
                  ((vector<miniscript::Node<CPubKey>::TreeEvalMaybe<miniscript::internal::InputResult,miniscript::Node<CPubKey>::TreeEval<miniscript::internal::InputResult,miniscript::Node<CPubKey>::ProduceInput<(anonymous_namespace)::Satisfier>((anonymous_namespace)::Satisfier_const&)const::_lambda(miniscript::Node<CPubKey>const&,Span<miniscript::internal::InputResult>)_2_>(miniscript::Node<CPubKey>::ProduceInput<(anonymous_namespace)::Satisfier>((anonymous_namespace)::Satisfier_const&)const::_lambda(miniscript::Node<CPubKey>const&,Span<miniscript::internal::InputResult>)_2_)const::DummyState,miniscript::Node<CPubKey>::TreeEval<miniscript::internal::InputResult,miniscript::Node<CPubKey>::ProduceInput<(anonymous_namespace)::Satisfier>((anonymous_namespace)::Satisfier_const&)const::_lambda(miniscript::Node<CPubKey>const&,Span<miniscript::internal::InputResult>)_2_>(miniscript::Node<CPubKey>::ProduceInput<(anonymous_namespace)::Satisfier>((anonymous_namespace)::Satisfier_const&)const::_lambda(miniscript::No___State,miniscript::Node<CPubKey>const&,Span<miniscript::internal::InputResult>)_1_)const::StackElem>>
                    *)&local_118,
                   __args_2[uVar2].
                   super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,(int *)this_01,(bool *)__args_2);
        pvVar4 = pvStack_110;
        pvVar7 = local_118;
      }
      else {
        if ((ulong)(((long)local_138.
                           super__Vector_base<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_138.
                           super__Vector_base<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x3333333333333333) <
            subres.m_size) {
          __assert_fail("results.size() >= node.subs.size()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                        ,0x273,
                        "std::optional<Result> miniscript::Node<CPubKey>::TreeEvalMaybe(State, DownFn, UpFn) const [Key = CPubKey, Result = miniscript::internal::InputResult, State = DummyState, DownFn = (lambda at /workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h:678:13), UpFn = (lambda at /workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h:679:13)]"
                       );
        }
        subres.m_data =
             (InputResult *)
             ((long)local_138.
                    super__Vector_base<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
                    ._M_impl.super__Vector_impl_data._M_start +
             subres.m_size * -0x50 +
             ((long)local_138.
                    super__Vector_base<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_138.
                   super__Vector_base<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
                   ._M_impl.super__Vector_impl_data._M_start));
        anon_func::anon_class_8_1_ba1d3d87::operator()
                  ((InputResult *)local_f8,&local_140,node,subres);
        uVar1 = (node->typ).m_flags;
        bVar3 = (byte)uVar1;
        if (((local_f8._0_4_ != NO & bVar3 >> 4) == 1) && (local_e8._8_8_ != local_e8._0_8_)) {
          __assert_fail("ret.nsat.stack.size() == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                        ,0x55b,
                        "auto miniscript::Node<CPubKey>::ProduceInput(const (anonymous namespace)::Satisfier &)::(anonymous class)::operator()(const Node<Key> &, Span<InputResult>) const [Key = CPubKey]"
                       );
        }
        if (((local_e8._24_4_ != 0 & bVar3 >> 4) == 1) && (local_e8._48_8_ != local_e8._40_8_)) {
          __assert_fail("ret.sat.stack.size() == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                        ,0x55c,
                        "auto miniscript::Node<CPubKey>::ProduceInput(const (anonymous namespace)::Satisfier &)::(anonymous class)::operator()(const Node<Key> &, Span<InputResult>) const [Key = CPubKey]"
                       );
        }
        if (((bVar3 >> 5 & local_f8._0_4_ != NO) == 1) && (local_e8._8_8_ - local_e8._0_8_ != 0x18))
        {
          __assert_fail("ret.nsat.stack.size() == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                        ,0x55f,
                        "auto miniscript::Node<CPubKey>::ProduceInput(const (anonymous namespace)::Satisfier &)::(anonymous class)::operator()(const Node<Key> &, Span<InputResult>) const [Key = CPubKey]"
                       );
        }
        if (((local_e8._24_4_ != 0 & bVar3 >> 5) == 1) &&
           (local_e8._48_8_ - local_e8._40_8_ != 0x18)) {
          __assert_fail("ret.sat.stack.size() == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                        ,0x560,
                        "auto miniscript::Node<CPubKey>::ProduceInput(const (anonymous namespace)::Satisfier &)::(anonymous class)::operator()(const Node<Key> &, Span<InputResult>) const [Key = CPubKey]"
                       );
        }
        bVar5 = bVar3 >> 6 & local_e8._24_4_ != 0;
        if ((bVar5 == 1) && (local_e8._48_8_ == local_e8._40_8_)) {
          __assert_fail("ret.sat.stack.size() >= 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                        ,0x564,
                        "auto miniscript::Node<CPubKey>::ProduceInput(const (anonymous namespace)::Satisfier &)::(anonymous class)::operator()(const Node<Key> &, Span<InputResult>) const [Key = CPubKey]"
                       );
        }
        if (((local_f8._0_4_ != NO & bVar3 >> 6) == 1) && (local_e8._8_8_ == local_e8._0_8_)) {
          __assert_fail("ret.nsat.stack.size() >= 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                        ,0x565,
                        "auto miniscript::Node<CPubKey>::ProduceInput(const (anonymous namespace)::Satisfier &)::(anonymous class)::operator()(const Node<Key> &, Span<InputResult>) const [Key = CPubKey]"
                       );
        }
        if ((bVar5 != 0) &&
           ((((pointer)(local_e8._48_8_ - 0x18))->
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_start == *(pointer *)(local_e8._48_8_ - 0x10))) {
          __assert_fail("!ret.sat.stack.back().empty()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                        ,0x566,
                        "auto miniscript::Node<CPubKey>::ProduceInput(const (anonymous namespace)::Satisfier &)::(anonymous class)::operator()(const Node<Key> &, Span<InputResult>) const [Key = CPubKey]"
                       );
        }
        if (local_f8._0_4_ == NO && (char)bVar3 < '\0') {
          __assert_fail("ret.nsat.available != Availability::NO",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                        ,0x56a,
                        "auto miniscript::Node<CPubKey>::ProduceInput(const (anonymous namespace)::Satisfier &)::(anonymous class)::operator()(const Node<Key> &, Span<InputResult>) const [Key = CPubKey]"
                       );
        }
        if (((char)bVar3 < '\0' & local_f8[4]) == 1) {
          __assert_fail("!ret.nsat.has_sig",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                        ,0x56b,
                        "auto miniscript::Node<CPubKey>::ProduceInput(const (anonymous namespace)::Satisfier &)::(anonymous class)::operator()(const Node<Key> &, Span<InputResult>) const [Key = CPubKey]"
                       );
        }
        if ((((char)bVar3 < '\0') && ((local_f8._0_8_ & 0x10000000000) == 0)) &&
           ((local_f8._0_8_ & 0x1000000000000) != 0)) {
          __assert_fail("!ret.nsat.non_canon",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                        ,0x56c,
                        "auto miniscript::Node<CPubKey>::ProduceInput(const (anonymous namespace)::Satisfier &)::(anonymous class)::operator()(const Node<Key> &, Span<InputResult>) const [Key = CPubKey]"
                       );
        }
        if ((local_f8._0_4_ != NO && (local_f8._0_8_ & 0x100000000) == 0) && (uVar1 >> 10 & 1) != 0)
        {
          __assert_fail("ret.nsat.has_sig",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                        ,0x56f,
                        "auto miniscript::Node<CPubKey>::ProduceInput(const (anonymous namespace)::Satisfier &)::(anonymous class)::operator()(const Node<Key> &, Span<InputResult>) const [Key = CPubKey]"
                       );
        }
        if ((((byte)(uVar1 >> 0xb) & local_e8._24_4_ != 0) == 1) && (local_e8[0x1c] == '\0')) {
          __assert_fail("ret.sat.has_sig",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                        ,0x570,
                        "auto miniscript::Node<CPubKey>::ProduceInput(const (anonymous namespace)::Satisfier &)::(anonymous class)::operator()(const Node<Key> &, Span<InputResult>) const [Key = CPubKey]"
                       );
        }
        if ((uVar1 & 0x1200) == 0x1200 && local_f8._0_4_ == NO) {
          __assert_fail("ret.nsat.available != Availability::NO",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                        ,0x573,
                        "auto miniscript::Node<CPubKey>::ProduceInput(const (anonymous namespace)::Satisfier &)::(anonymous class)::operator()(const Node<Key> &, Span<InputResult>) const [Key = CPubKey]"
                       );
        }
        if (((uVar1 & 0x1200) == 0x1200 & local_f8[5]) == 1) {
          __assert_fail("!ret.nsat.malleable",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                        ,0x574,
                        "auto miniscript::Node<CPubKey>::ProduceInput(const (anonymous namespace)::Satisfier &)::(anonymous class)::operator()(const Node<Key> &, Span<InputResult>) const [Key = CPubKey]"
                       );
        }
        if ((byte)(local_e8._24_4_ != 0 & local_e8[0x1d] & (byte)(uVar1 >> 0xc)) == 1) {
          __assert_fail("!ret.sat.malleable",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                        ,0x577,
                        "auto miniscript::Node<CPubKey>::ProduceInput(const (anonymous namespace)::Satisfier &)::(anonymous class)::operator()(const Node<Key> &, Span<InputResult>) const [Key = CPubKey]"
                       );
        }
        if (((local_e8._24_4_ != 0) && ((local_e8._24_8_ & 0x10000000000) == 0)) &&
           ((local_e8._24_8_ & 0x1000000000000) != 0)) {
          __assert_fail("!ret.sat.non_canon",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                        ,0x57a,
                        "auto miniscript::Node<CPubKey>::ProduceInput(const (anonymous namespace)::Satisfier &)::(anonymous class)::operator()(const Node<Key> &, Span<InputResult>) const [Key = CPubKey]"
                       );
        }
        local_98._0_8_ = local_f8._0_8_;
        local_98._8_8_ = local_f8._8_8_;
        local_98._16_8_ = local_e8._0_8_;
        local_98._24_8_ = local_e8._8_8_;
        local_98._32_8_ = local_e8._16_8_;
        local_e8._16_8_ = (Node<CPubKey> *)0x0;
        local_e8._0_8_ = (_Optional_payload_base<miniscript::internal::InputResult> *)0x0;
        local_e8._8_8_ = (_Optional_payload_base<miniscript::internal::InputResult> *)0x0;
        local_98._40_8_ = local_e8._24_8_;
        local_98._48_8_ = local_e8._32_8_;
        local_60.
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_e8._40_8_;
        local_60.
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_e8._48_8_;
        local_60.
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_e8._56_8_;
        local_e8._56_8_ =
             (vector<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
              *)0x0;
        local_e8._40_8_ = (pointer)0x0;
        local_e8._48_8_ = (pointer)0x0;
        local_48 = true;
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   *)(local_e8 + 0x28));
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   *)this_02);
        if (local_48 == false) {
          local_e8[0x40] = 0;
          std::_Optional_payload_base<miniscript::internal::InputResult>::_M_reset
                    ((_Optional_payload_base<miniscript::internal::InputResult> *)local_98);
          goto LAB_0047cf8b;
        }
        std::
        vector<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
        ::_M_erase(this_00,local_138.
                           super__Vector_base<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
                           ._M_impl.super__Vector_impl_data._M_finish +
                           -((ulong)((long)(node->subs).
                                           super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(node->subs).
                                          super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 4),
                   (iterator)
                   local_138.
                   super__Vector_base<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        std::
        vector<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
        ::emplace_back<miniscript::internal::InputResult>(this_00,(InputResult *)this_01);
        pvVar4 = (void *)((long)pvVar4 + -0x18);
        pvStack_110 = pvVar4;
        std::_Optional_payload_base<miniscript::internal::InputResult>::_M_reset(this_01);
      }
    } while (pvVar4 != pvVar7);
  }
  if ((long)local_138.
            super__Vector_base<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_138.
            super__Vector_base<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
            ._M_impl.super__Vector_impl_data._M_start != 0x50) {
    __assert_fail("results.size() == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                  ,0x27e,
                  "std::optional<Result> miniscript::Node<CPubKey>::TreeEvalMaybe(State, DownFn, UpFn) const [Key = CPubKey, Result = miniscript::internal::InputResult, State = DummyState, DownFn = (lambda at /workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h:678:13), UpFn = (lambda at /workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h:679:13)]"
                 );
  }
  local_f8._0_8_ =
       *(undefined8 *)
        &(local_138.
          super__Vector_base<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
          ._M_impl.super__Vector_impl_data._M_start)->nsat;
  local_f8._8_8_ =
       ((local_138.
         super__Vector_base<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
         ._M_impl.super__Vector_impl_data._M_start)->nsat).size;
  this_02 = (_Optional_payload_base<miniscript::internal::InputResult> *)
            ((local_138.
              super__Vector_base<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
              ._M_impl.super__Vector_impl_data._M_start)->nsat).stack.
            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  this_01 = (_Optional_payload_base<miniscript::internal::InputResult> *)
            ((local_138.
              super__Vector_base<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
              ._M_impl.super__Vector_impl_data._M_start)->nsat).stack.
            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  node = (Node<CPubKey> *)
         ((local_138.
           super__Vector_base<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
           ._M_impl.super__Vector_impl_data._M_start)->nsat).stack.
         super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
  ((local_138.
    super__Vector_base<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
    ._M_impl.super__Vector_impl_data._M_start)->nsat).stack.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ((local_138.
    super__Vector_base<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
    ._M_impl.super__Vector_impl_data._M_start)->nsat).stack.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_138.
    super__Vector_base<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
    ._M_impl.super__Vector_impl_data._M_start)->nsat).stack.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8._24_8_ =
       *(undefined8 *)
        &(local_138.
          super__Vector_base<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
          ._M_impl.super__Vector_impl_data._M_start)->sat;
  local_e8._32_8_ =
       ((local_138.
         super__Vector_base<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
         ._M_impl.super__Vector_impl_data._M_start)->sat).size;
  local_150 = ((local_138.
                super__Vector_base<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
                ._M_impl.super__Vector_impl_data._M_start)->sat).stack.
              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_158 = ((local_138.
                super__Vector_base<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
                ._M_impl.super__Vector_impl_data._M_start)->sat).stack.
              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  this_00 = (vector<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
             *)((local_138.
                 super__Vector_base<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
                 ._M_impl.super__Vector_impl_data._M_start)->sat).stack.
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
  ((local_138.
    super__Vector_base<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
    ._M_impl.super__Vector_impl_data._M_start)->sat).stack.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ((local_138.
    super__Vector_base<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
    ._M_impl.super__Vector_impl_data._M_start)->sat).stack.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_138.
    super__Vector_base<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
    ._M_impl.super__Vector_impl_data._M_start)->sat).stack.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8[0x40] = 1;
  local_e8._0_8_ = this_02;
  local_e8._8_8_ = this_01;
  local_e8._16_8_ = node;
  local_e8._40_8_ = local_150;
  local_e8._48_8_ = local_158;
  local_e8._56_8_ = this_00;
LAB_0047cf8b:
  std::vector<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
  ::~vector(&local_138);
  if (pvVar7 != (void *)0x0) {
    operator_delete(pvVar7,local_108 - (long)pvVar7);
    local_150 = (pointer)local_e8._40_8_;
    local_158 = (pointer)local_e8._48_8_;
    this_00 = (vector<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
               *)local_e8._56_8_;
    this_01 = (_Optional_payload_base<miniscript::internal::InputResult> *)local_e8._8_8_;
    node = (Node<CPubKey> *)local_e8._16_8_;
    this_02 = (_Optional_payload_base<miniscript::internal::InputResult> *)local_e8._0_8_;
  }
  local_98._0_8_ = local_f8._0_8_;
  local_98._8_8_ = local_f8._8_8_;
  local_e8._0_8_ = (pointer)0x0;
  local_e8._8_8_ = 0;
  local_e8._16_8_ = (pointer)0x0;
  local_98._40_8_ = local_e8._24_8_;
  local_98._48_8_ = local_e8._32_8_;
  local_60.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = local_150;
  local_60.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = local_158;
  local_e8._40_8_ = 0;
  local_e8._48_8_ = 0;
  local_e8._56_8_ = (pointer)0x0;
  local_98._16_8_ = this_02;
  local_98._24_8_ = this_01;
  local_98._32_8_ = node;
  local_60.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this_00;
  std::_Optional_payload_base<miniscript::internal::InputResult>::_M_reset
            ((_Optional_payload_base<miniscript::internal::InputResult> *)local_f8);
  if ((!nonmalleable) ||
     ((AVar6 = NO, (bool)local_98[0x2d] == false && ((bool)local_98[0x2c] == true)))) {
    local_e8._0_8_ =
         (stack->
         super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_end_of_storage;
    (stack->
    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this_00;
    local_f8._0_8_ =
         (stack->
         super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
    local_f8._8_8_ =
         (stack->
         super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    (stack->
    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = local_150;
    (stack->
    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = local_158;
    local_60.
    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_60.
    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_60.
    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               *)local_f8);
    AVar6 = local_98._40_4_;
  }
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector(&local_60);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             *)(local_98 + 0x10));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return AVar6;
  }
  __stack_chk_fail();
}

Assistant:

Availability Satisfy(const Ctx& ctx, std::vector<std::vector<unsigned char>>& stack, bool nonmalleable = true) const {
        auto ret = ProduceInput(ctx);
        if (nonmalleable && (ret.sat.malleable || !ret.sat.has_sig)) return Availability::NO;
        stack = std::move(ret.sat.stack);
        return ret.sat.available;
    }